

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::stream_best(SSPMSolver *this,ostream *out,int h)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  if (*this->best_d == -1) {
    pcVar1 = " \x1b[1;33mTop\x1b[m";
  }
  else {
    std::operator<<(out," { ");
    lVar4 = 0;
    for (uVar2 = 0; uVar2 != (~(h >> 0x1f) & h); uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::operator<<(out,",");
      }
      iVar3 = 0;
      for (lVar4 = (long)(int)lVar4; (lVar4 < this->l && (this->best_d[lVar4] == uVar2));
          lVar4 = lVar4 + 1) {
        std::ostream::_M_insert<bool>(SUB81(out,0));
        iVar3 = iVar3 + -1;
      }
      if (iVar3 == 0) {
        std::operator<<(out,anon_var_dwarf_200a4b);
      }
    }
    pcVar1 = " }";
  }
  std::operator<<(out,pcVar1);
  return;
}

Assistant:

void
SSPMSolver::stream_best(std::ostream &out, int h)
{
    if (best_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and best_d[j] == i) {
                c++;
                out << best_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}